

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

BreakpointProbe * __thiscall
JsrtDebugManager::SetBreakpointHelper_TTD
          (JsrtDebugManager *this,int64 desiredBpId,ScriptContext *scriptContext,
          Utf8SourceInfo *utf8SourceInfo,UINT lineNumber,UINT columnNumber,BOOL *isNewBP)

{
  StatementLocation statement_00;
  StatementLocation statement_01;
  HRESULT HVar1;
  charcount_t cVar2;
  BOOL BVar3;
  DebugDocument *this_00;
  size_t sVar4;
  BreakpointProbe *pBVar5;
  JsrtDebugDocumentManager *this_01;
  undefined1 auStack_60 [8];
  StatementLocation statement;
  charcount_t byteOffset;
  
  *isNewBP = 0;
  this_00 = Js::Utf8SourceInfo::GetDebugDocument(utf8SourceInfo);
  if (((this_00 != (DebugDocument *)0x0) &&
      (HVar1 = Js::Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(utf8SourceInfo), -1 < HVar1)) &&
     (sVar4 = Js::Utf8SourceInfo::GetLineCount(utf8SourceInfo), lineNumber < sVar4)) {
    statement.bytecodeSpan.end = 0;
    cVar2 = Js::LineOffsetCache::GetCharacterOffsetForLine
                      ((utf8SourceInfo->m_lineOffsetCache).ptr,lineNumber,
                       (charcount_t *)&statement.bytecodeSpan.end);
    statement.function = (FunctionBody *)0x0;
    statement.statement.begin = 0;
    statement.statement.end = 0;
    BVar3 = Js::DebugDocument::GetStatementLocation
                      (this_00,columnNumber + cVar2 + 1,(StatementLocation *)auStack_60);
    if (BVar3 != 0) {
      statement_00.statement = (Interval)statement.function;
      statement_00.function = (FunctionBody *)auStack_60;
      statement_00.bytecodeSpan = statement.statement;
      pBVar5 = Js::DebugDocument::FindBreakpoint(this_00,statement_00);
      if (desiredBpId != -1 && pBVar5 != (BreakpointProbe *)0x0) {
        TTDAbort_unrecoverable_error
                  ("We shouldn\'t be resetting this BP unless it was cleared earlier!");
      }
      if (pBVar5 != (BreakpointProbe *)0x0) {
        return pBVar5;
      }
      statement_01.statement = (Interval)statement.function;
      statement_01.function = (FunctionBody *)auStack_60;
      statement_01.bytecodeSpan = statement.statement;
      pBVar5 = Js::DebugDocument::SetBreakPoint_TTDWbpId(this_00,desiredBpId,statement_01);
      *isNewBP = 1;
      this_01 = GetDebugDocumentManager(this);
      JsrtDebugDocumentManager::AddDocument(this_01,pBVar5->breakpointId,this_00);
      return pBVar5;
    }
  }
  return (BreakpointProbe *)0x0;
}

Assistant:

Js::BreakpointProbe* JsrtDebugManager::SetBreakpointHelper_TTD(int64 desiredBpId, Js::ScriptContext* scriptContext, Js::Utf8SourceInfo* utf8SourceInfo, UINT lineNumber, UINT columnNumber, BOOL* isNewBP)
{
    *isNewBP = FALSE;
    Js::DebugDocument* debugDocument = utf8SourceInfo->GetDebugDocument();
    if(debugDocument != nullptr && SUCCEEDED(utf8SourceInfo->EnsureLineOffsetCacheNoThrow()) && lineNumber < utf8SourceInfo->GetLineCount())
    {
        charcount_t charPosition = 0;
        charcount_t byteOffset = 0;
        utf8SourceInfo->GetCharPositionForLineInfo((charcount_t)lineNumber, &charPosition, &byteOffset);
        long ibos = charPosition + columnNumber + 1;

        Js::StatementLocation statement;
        if(!debugDocument->GetStatementLocation(ibos, &statement))
        {
            return nullptr;
        }

        // Don't see a use case for supporting multiple breakpoints at same location.
        // If a breakpoint already exists, just return that
        Js::BreakpointProbe* probe = debugDocument->FindBreakpoint(statement);
        TTDAssert(probe == nullptr || desiredBpId == -1, "We shouldn't be resetting this BP unless it was cleared earlier!");

        if(probe == nullptr)
        {
            probe = debugDocument->SetBreakPoint_TTDWbpId(desiredBpId, statement);
            *isNewBP = TRUE;

            this->GetDebugDocumentManager()->AddDocument(probe->GetId(), debugDocument);
        }

        return probe;
    }

    return nullptr;
}